

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deProcess.cpp
# Opt level: O0

void __thiscall de::Process::start(Process *this,char *commandLine,char *workingDirectory)

{
  deBool dVar1;
  ProcessError *this_00;
  char *__s;
  allocator<char> local_4d [13];
  string local_40;
  char *local_20;
  char *workingDirectory_local;
  char *commandLine_local;
  Process *this_local;
  
  local_20 = workingDirectory;
  workingDirectory_local = commandLine;
  commandLine_local = (char *)this;
  dVar1 = deProcess_start(this->m_process,commandLine,workingDirectory);
  if (dVar1 == 0) {
    this_00 = (ProcessError *)__cxa_allocate_exception(0x10);
    __s = deProcess_getLastError(this->m_process);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,__s,local_4d);
    ProcessError::ProcessError(this_00,&local_40);
    __cxa_throw(this_00,&ProcessError::typeinfo,ProcessError::~ProcessError);
  }
  return;
}

Assistant:

void Process::start (const char* commandLine, const char* workingDirectory)
{
	if (!deProcess_start(m_process, commandLine, workingDirectory))
		throw ProcessError(deProcess_getLastError(m_process));
}